

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O2

void duckdb::TestVectorConstant::Generate(TestVectorInfo *info)

{
  bool bVar1;
  pointer pDVar2;
  Allocator *allocator;
  reference pvVar3;
  Value *val;
  idx_t c;
  ulong __n;
  idx_t local_58;
  templated_unique_single_t result;
  TestGeneratedValues values;
  
  TestVectorFlat::GenerateValues(&values,info);
  local_58 = 3;
  bVar1 = true;
  while (bVar1) {
    make_uniq<duckdb::DataChunk>();
    pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         *)&result.
                            super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                       );
    allocator = Allocator::DefaultAllocator();
    DataChunk::Initialize(pDVar2,allocator,info->types,0x800);
    for (__n = 0; __n < (ulong)(((long)(info->types->
                                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       ).
                                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(info->types->
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ).
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        __n = __n + 1) {
      pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                           *)&result.
                              super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                         );
      pvVar3 = vector<duckdb::Vector,_true>::get<true>(&pDVar2->data,__n);
      val = TestGeneratedValues::GetValue(&values,0,__n);
      Vector::SetValue(pvVar3,0,val);
      pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                           *)&result.
                              super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                         );
      pvVar3 = vector<duckdb::Vector,_true>::get<true>(&pDVar2->data,__n);
      Vector::SetVectorType(pvVar3,CONSTANT_VECTOR);
    }
    pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         *)&result.
                            super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                       );
    pDVar2->count = local_58;
    ::std::
    vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
              ((vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                *)info->entries,
               (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
               &result.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
    ;
    ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
              (&result.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
    ;
    local_58 = 0xfffffffffffff803;
    bVar1 = false;
  }
  ::std::
  vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ::~vector((vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
             *)&values);
  return;
}

Assistant:

static void Generate(TestVectorInfo &info) {
		auto values = TestVectorFlat::GenerateValues(info);
		for (idx_t cur_row = 0; cur_row < TestVectorFlat::TEST_VECTOR_CARDINALITY; cur_row += STANDARD_VECTOR_SIZE) {
			auto result = make_uniq<DataChunk>();
			result->Initialize(Allocator::DefaultAllocator(), info.types);
			auto cardinality = MinValue<idx_t>(STANDARD_VECTOR_SIZE, TestVectorFlat::TEST_VECTOR_CARDINALITY - cur_row);
			for (idx_t c = 0; c < info.types.size(); c++) {
				result->data[c].SetValue(0, values.GetValue(0, c));
				result->data[c].SetVectorType(VectorType::CONSTANT_VECTOR);
			}
			result->SetCardinality(cardinality);

			info.entries.push_back(std::move(result));
		}
	}